

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

xmlElementPtr
xmlAddElementDecl(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *name,xmlElementTypeVal type,
                 xmlElementContentPtr content)

{
  _xmlDtd *p_Var1;
  _xmlNode *p_Var2;
  int iVar3;
  _xmlNode *p_Var4;
  xmlHashTablePtr table;
  xmlElementPtr elem;
  xmlChar *pxVar5;
  xmlElementContentPtr pxVar6;
  char *msg;
  _xmlDict *dict;
  _xmlNode **pp_Var7;
  xmlChar *ns;
  _xmlNode *local_50;
  xmlValidCtxtPtr local_48;
  xmlAttributePtr local_40;
  _xmlNode *local_38;
  
  if (name == (xmlChar *)0x0 || dtd == (xmlDtdPtr)0x0) {
    return (xmlElementPtr)0x0;
  }
  switch(type) {
  case XML_ELEMENT_TYPE_EMPTY:
    if (content != (xmlElementContentPtr)0x0) {
      msg = "xmlAddElementDecl: content != NULL for EMPTY\n";
      goto LAB_0018f1bb;
    }
    break;
  case XML_ELEMENT_TYPE_ANY:
    if (content != (xmlElementContentPtr)0x0) {
      msg = "xmlAddElementDecl: content != NULL for ANY\n";
      goto LAB_0018f1bb;
    }
    break;
  case XML_ELEMENT_TYPE_MIXED:
    if (content == (xmlElementContentPtr)0x0) {
      msg = "xmlAddElementDecl: content == NULL for MIXED\n";
      goto LAB_0018f1bb;
    }
    break;
  case XML_ELEMENT_TYPE_ELEMENT:
    if (content == (xmlElementContentPtr)0x0) {
      msg = "xmlAddElementDecl: content == NULL for ELEMENT\n";
      goto LAB_0018f1bb;
    }
    break;
  default:
    msg = "Internal: ELEMENT decl corrupted invalid type\n";
LAB_0018f1bb:
    xmlErrValid(ctxt,XML_ERR_INTERNAL_ERROR,msg,(char *)0x0);
    return (xmlElementPtr)0x0;
  }
  local_48 = ctxt;
  p_Var4 = (_xmlNode *)xmlSplitQName2(name,(xmlChar **)&local_50);
  if (p_Var4 != (_xmlNode *)0x0) {
    name = (xmlChar *)p_Var4;
  }
  table = (xmlHashTablePtr)dtd->elements;
  if (table == (xmlHashTablePtr)0x0) {
    if (dtd->doc == (_xmlDoc *)0x0) {
      dict = (xmlDictPtr)0x0;
    }
    else {
      dict = dtd->doc->dict;
    }
    table = xmlHashCreateDict(0,dict);
    dtd->elements = table;
  }
  if (table == (xmlHashTablePtr)0x0) {
    xmlVErrMemory(local_48,"xmlAddElementDecl: Table creation failed!\n");
  }
  else {
    local_38 = p_Var4;
    if ((((dtd->doc == (_xmlDoc *)0x0) || (p_Var1 = dtd->doc->intSubset, p_Var1 == (_xmlDtd *)0x0))
        || (elem = (xmlElementPtr)
                   xmlHashLookup2((xmlHashTablePtr)p_Var1->elements,name,(xmlChar *)local_50),
           elem == (xmlElementPtr)0x0)) || (elem->etype != XML_ELEMENT_TYPE_UNDEFINED)) {
      local_40 = (xmlAttributePtr)0x0;
    }
    else {
      local_40 = elem->attributes;
      elem->attributes = (xmlAttributePtr)0x0;
      xmlHashRemoveEntry2((xmlHashTablePtr)dtd->doc->intSubset->elements,name,(xmlChar *)local_50,
                          (xmlHashDeallocator)0x0);
      xmlFreeElement(elem);
    }
    p_Var4 = (_xmlNode *)xmlHashLookup2(table,name,(xmlChar *)local_50);
    if (p_Var4 == (_xmlNode *)0x0) {
      p_Var4 = (_xmlNode *)(*xmlMalloc)(0x70);
      if (p_Var4 != (_xmlNode *)0x0) {
        p_Var4->_private = (void *)0x0;
        *(undefined8 *)&p_Var4->type = 0;
        p_Var4->nsDef = (xmlNs *)0x0;
        p_Var4->psvi = (void *)0x0;
        p_Var4->content = (xmlChar *)0x0;
        p_Var4->properties = (_xmlAttr *)0x0;
        p_Var4->doc = (_xmlDoc *)0x0;
        p_Var4->ns = (xmlNs *)0x0;
        p_Var4->next = (_xmlNode *)0x0;
        p_Var4->prev = (_xmlNode *)0x0;
        p_Var4->last = (_xmlNode *)0x0;
        p_Var4->parent = (_xmlNode *)0x0;
        p_Var4->name = (xmlChar *)0x0;
        p_Var4->children = (_xmlNode *)0x0;
        p_Var4->type = XML_ELEMENT_DECL;
        pxVar5 = xmlStrdup(name);
        p_Var4->name = pxVar5;
        if (pxVar5 == (xmlChar *)0x0) {
          xmlVErrMemory(local_48,"malloc failed");
          if (local_38 != (_xmlNode *)0x0) {
            (*xmlFree)(local_38);
          }
          if (local_50 != (_xmlNode *)0x0) {
            (*xmlFree)(local_50);
          }
        }
        else {
          p_Var4->nsDef = (xmlNs *)local_50;
          iVar3 = xmlHashAddEntry2(table,name,(xmlChar *)local_50,p_Var4);
          if (iVar3 == 0) {
            p_Var4->properties = (_xmlAttr *)local_40;
            goto LAB_0018f458;
          }
          xmlErrValidNode(local_48,(xmlNodePtr)dtd,XML_DTD_ELEM_REDEFINED,
                          "Redefinition of element %s\n",name,(xmlChar *)0x0,(xmlChar *)0x0);
          xmlFreeElement((xmlElementPtr)p_Var4);
          p_Var4 = local_38;
          if (local_38 == (_xmlNode *)0x0) {
            return (xmlElementPtr)0x0;
          }
        }
        goto LAB_0018f3c6;
      }
      xmlVErrMemory(local_48,"malloc failed");
      p_Var4 = local_38;
    }
    else {
      if (*(int *)&p_Var4->ns == 0) {
        if (local_50 != (_xmlNode *)0x0) {
          (*xmlFree)(local_50);
          local_50 = (_xmlNode *)0x0;
        }
LAB_0018f458:
        *(xmlElementTypeVal *)&p_Var4->ns = type;
        if ((local_48 == (xmlValidCtxtPtr)0x0) || ((local_48->flags & 2) == 0)) {
          pxVar6 = xmlCopyDocElementContent(dtd->doc,content);
          p_Var4->content = (xmlChar *)pxVar6;
        }
        else {
          p_Var4->content = (xmlChar *)content;
          if (content != (xmlElementContentPtr)0x0) {
            content->parent = (_xmlElementContent *)&DAT_00000001;
          }
        }
        p_Var4->parent = (_xmlNode *)dtd;
        p_Var4->doc = dtd->doc;
        p_Var2 = dtd->last;
        if (p_Var2 == (_xmlNode *)0x0) {
          dtd->last = p_Var4;
          pp_Var7 = &dtd->children;
        }
        else {
          pp_Var7 = &dtd->last;
          p_Var2->next = p_Var4;
          p_Var4->prev = p_Var2;
        }
        *pp_Var7 = p_Var4;
        if (local_38 == (_xmlNode *)0x0) {
          return (xmlElementPtr)p_Var4;
        }
        (*xmlFree)(local_38);
        return (xmlElementPtr)p_Var4;
      }
      xmlErrValidNode(local_48,(xmlNodePtr)dtd,XML_DTD_ELEM_REDEFINED,"Redefinition of element %s\n"
                      ,name,(xmlChar *)0x0,(xmlChar *)0x0);
      p_Var4 = local_38;
    }
  }
  if (p_Var4 != (_xmlNode *)0x0) {
    (*xmlFree)(p_Var4);
  }
  p_Var4 = local_50;
  if (local_50 == (_xmlNode *)0x0) {
    return (xmlElementPtr)0x0;
  }
LAB_0018f3c6:
  (*xmlFree)(p_Var4);
  return (xmlElementPtr)0x0;
}

Assistant:

xmlElementPtr
xmlAddElementDecl(xmlValidCtxtPtr ctxt,
                  xmlDtdPtr dtd, const xmlChar *name,
                  xmlElementTypeVal type,
		  xmlElementContentPtr content) {
    xmlElementPtr ret;
    xmlElementTablePtr table;
    xmlAttributePtr oldAttributes = NULL;
    xmlChar *ns, *uqname;

    if (dtd == NULL) {
	return(NULL);
    }
    if (name == NULL) {
	return(NULL);
    }

    switch (type) {
        case XML_ELEMENT_TYPE_EMPTY:
	    if (content != NULL) {
		xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		        "xmlAddElementDecl: content != NULL for EMPTY\n",
			NULL);
		return(NULL);
	    }
	    break;
	case XML_ELEMENT_TYPE_ANY:
	    if (content != NULL) {
		xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		        "xmlAddElementDecl: content != NULL for ANY\n",
			NULL);
		return(NULL);
	    }
	    break;
	case XML_ELEMENT_TYPE_MIXED:
	    if (content == NULL) {
		xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		        "xmlAddElementDecl: content == NULL for MIXED\n",
			NULL);
		return(NULL);
	    }
	    break;
	case XML_ELEMENT_TYPE_ELEMENT:
	    if (content == NULL) {
		xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		        "xmlAddElementDecl: content == NULL for ELEMENT\n",
			NULL);
		return(NULL);
	    }
	    break;
	default:
	    xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		    "Internal: ELEMENT decl corrupted invalid type\n",
		    NULL);
	    return(NULL);
    }

    /*
     * check if name is a QName
     */
    uqname = xmlSplitQName2(name, &ns);
    if (uqname != NULL)
	name = uqname;

    /*
     * Create the Element table if needed.
     */
    table = (xmlElementTablePtr) dtd->elements;
    if (table == NULL) {
	xmlDictPtr dict = NULL;

	if (dtd->doc != NULL)
	    dict = dtd->doc->dict;
        table = xmlHashCreateDict(0, dict);
	dtd->elements = (void *) table;
    }
    if (table == NULL) {
	xmlVErrMemory(ctxt,
            "xmlAddElementDecl: Table creation failed!\n");
	if (uqname != NULL)
	    xmlFree(uqname);
	if (ns != NULL)
	    xmlFree(ns);
        return(NULL);
    }

    /*
     * lookup old attributes inserted on an undefined element in the
     * internal subset.
     */
    if ((dtd->doc != NULL) && (dtd->doc->intSubset != NULL)) {
	ret = xmlHashLookup2(dtd->doc->intSubset->elements, name, ns);
	if ((ret != NULL) && (ret->etype == XML_ELEMENT_TYPE_UNDEFINED)) {
	    oldAttributes = ret->attributes;
	    ret->attributes = NULL;
	    xmlHashRemoveEntry2(dtd->doc->intSubset->elements, name, ns, NULL);
	    xmlFreeElement(ret);
	}
    }

    /*
     * The element may already be present if one of its attribute
     * was registered first
     */
    ret = xmlHashLookup2(table, name, ns);
    if (ret != NULL) {
	if (ret->etype != XML_ELEMENT_TYPE_UNDEFINED) {
#ifdef LIBXML_VALID_ENABLED
	    /*
	     * The element is already defined in this DTD.
	     */
	    xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_ELEM_REDEFINED,
	                    "Redefinition of element %s\n",
			    name, NULL, NULL);
#endif /* LIBXML_VALID_ENABLED */
	    if (uqname != NULL)
		xmlFree(uqname);
            if (ns != NULL)
	        xmlFree(ns);
	    return(NULL);
	}
	if (ns != NULL) {
	    xmlFree(ns);
	    ns = NULL;
	}
    } else {
	ret = (xmlElementPtr) xmlMalloc(sizeof(xmlElement));
	if (ret == NULL) {
	    xmlVErrMemory(ctxt, "malloc failed");
	    if (uqname != NULL)
		xmlFree(uqname);
            if (ns != NULL)
	        xmlFree(ns);
	    return(NULL);
	}
	memset(ret, 0, sizeof(xmlElement));
	ret->type = XML_ELEMENT_DECL;

	/*
	 * fill the structure.
	 */
	ret->name = xmlStrdup(name);
	if (ret->name == NULL) {
	    xmlVErrMemory(ctxt, "malloc failed");
	    if (uqname != NULL)
		xmlFree(uqname);
            if (ns != NULL)
	        xmlFree(ns);
	    xmlFree(ret);
	    return(NULL);
	}
	ret->prefix = ns;

	/*
	 * Validity Check:
	 * Insertion must not fail
	 */
	if (xmlHashAddEntry2(table, name, ns, ret)) {
#ifdef LIBXML_VALID_ENABLED
	    /*
	     * The element is already defined in this DTD.
	     */
	    xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_ELEM_REDEFINED,
	                    "Redefinition of element %s\n",
			    name, NULL, NULL);
#endif /* LIBXML_VALID_ENABLED */
	    xmlFreeElement(ret);
	    if (uqname != NULL)
		xmlFree(uqname);
	    return(NULL);
	}
	/*
	 * For new element, may have attributes from earlier
	 * definition in internal subset
	 */
	ret->attributes = oldAttributes;
    }

    /*
     * Finish to fill the structure.
     */
    ret->etype = type;
    /*
     * Avoid a stupid copy when called by the parser
     * and flag it by setting a special parent value
     * so the parser doesn't unallocate it.
     */
    if ((ctxt != NULL) && (ctxt->flags & XML_VCTXT_USE_PCTXT)) {
	ret->content = content;
	if (content != NULL)
	    content->parent = (xmlElementContentPtr) 1;
    } else {
	ret->content = xmlCopyDocElementContent(dtd->doc, content);
    }

    /*
     * Link it to the DTD
     */
    ret->parent = dtd;
    ret->doc = dtd->doc;
    if (dtd->last == NULL) {
	dtd->children = dtd->last = (xmlNodePtr) ret;
    } else {
        dtd->last->next = (xmlNodePtr) ret;
	ret->prev = dtd->last;
	dtd->last = (xmlNodePtr) ret;
    }
    if (uqname != NULL)
	xmlFree(uqname);
    return(ret);
}